

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall
chaiscript::detail::Dispatch_Engine::add_object(Dispatch_Engine *this,string *name,Boxed_Value *obj)

{
  Stack_Holder *t_holder;
  Boxed_Value local_50;
  string local_40;
  Boxed_Value *local_20;
  Boxed_Value *obj_local;
  string *name_local;
  Dispatch_Engine *this_local;
  
  local_20 = obj;
  obj_local = (Boxed_Value *)name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_40,name);
  Boxed_Value::Boxed_Value(&local_50,obj);
  t_holder = get_stack_holder(this);
  add_object(this,&local_40,&local_50,t_holder);
  Boxed_Value::~Boxed_Value(&local_50);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void add_object(const std::string &name, Boxed_Value obj) { add_object(name, std::move(obj), get_stack_holder()); }